

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O2

void nn_sinproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  byte *pbVar1;
  int *self_00;
  int iVar2;
  int iVar3;
  ulong uVar4;
  nn_fsm_event *event;
  char *pcVar5;
  nn_fsm *dst;
  FILE *__stream;
  ulong uVar6;
  undefined8 uVar7;
  
  uVar6 = (ulong)(uint)src;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected action";
      uVar6 = 0xfffffffffffffffe;
      uVar7 = 0x14e;
    }
    else {
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected source";
      uVar7 = 0x152;
    }
    break;
  case 2:
    if (src == 0x6c41) {
      if (type == 2) {
        self[1].shutdown_fn = (nn_fsm_fn)srcptr;
        iVar2 = nn_pipebase_start((nn_pipebase *)&self[1].state);
        if (iVar2 == 0) {
          *(undefined4 *)&self[1].fn = 4;
          dst = (nn_fsm *)self[1].shutdown_fn;
          event = (nn_fsm_event *)&self[5].ctx;
          iVar2 = 3;
LAB_0012c4aa:
          nn_fsm_raiseto(self,dst,event,0x6c41,iVar2,self);
          return;
        }
        nn_backtrace_print();
        __stream = _stderr;
        pcVar5 = nn_err_strerror(-iVar2);
        uVar6 = (ulong)(uint)-iVar2;
        uVar7 = 0x16b;
LAB_0012c568:
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar5,uVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
                ,uVar7);
        goto LAB_0012c572;
      }
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected action";
      uVar6 = 0x6c41;
      uVar7 = 0x172;
    }
    else if (src == -2) {
      if (type == 1) {
        *(undefined4 *)&self[1].fn = 3;
        return;
      }
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected action";
      uVar6 = 0xfffffffffffffffe;
      uVar7 = 0x163;
    }
    else {
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected source";
      uVar7 = 0x176;
    }
    break;
  case 3:
    if (src == 0x6c41) {
      if (type == 3) {
        iVar2 = nn_pipebase_start((nn_pipebase *)&self[1].state);
        if (iVar2 != 0) {
          nn_pipebase_stop((nn_pipebase *)&self[1].state);
          *(undefined4 *)&self[1].fn = 5;
          self[1].shutdown_fn = (nn_fsm_fn)0x0;
          goto LAB_0012c467;
        }
LAB_0012c3f5:
        *(undefined4 *)&self[1].fn = 4;
        return;
      }
      if (type == 2) {
        iVar2 = nn_pipebase_start((nn_pipebase *)&self[1].state);
        if (iVar2 == 0) goto LAB_0012c3f5;
        nn_backtrace_print();
        __stream = _stderr;
        pcVar5 = nn_err_strerror(-iVar2);
        uVar6 = (ulong)(uint)-iVar2;
        uVar7 = 0x186;
        goto LAB_0012c568;
      }
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected action";
      uVar6 = 0x6c41;
      uVar7 = 0x199;
    }
    else {
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected source";
      uVar7 = 0x19d;
    }
    break;
  case 4:
    if (src == 0x6c41) {
      if (type == 6) {
        nn_pipebase_stop((nn_pipebase *)&self[1].state);
        nn_fsm_raiseto(self,(nn_fsm *)self[1].shutdown_fn,
                       (nn_fsm_event *)&((nn_fsm *)self[1].shutdown_fn)[6].stopped.type,0x6c41,6,
                       self);
        *(undefined4 *)&self[1].fn = 5;
        self[1].shutdown_fn = (nn_fsm_fn)0x0;
LAB_0012c467:
        nn_fsm_raise(self,(nn_fsm_event *)&self[6].stopped.type,6);
        return;
      }
      if (type == 5) {
        if (((ulong)self[1].fn & 0x100000000) != 0) {
          nn_pipebase_sent((nn_pipebase *)&self[1].state);
          pbVar1 = (byte *)((long)&self[1].fn + 4);
          *pbVar1 = *pbVar1 & 0xfe;
          return;
        }
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sinproc->flags & NN_SINPROC_FLAG_SENDING",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
                ,0x1c2);
        goto LAB_0012c572;
      }
      if (type == 4) {
        self_00 = &self[3].stopped.src;
        iVar2 = nn_msgqueue_empty((nn_msgqueue *)self_00);
        iVar3 = nn_msgqueue_send((nn_msgqueue *)self_00,(nn_msg *)(self[1].shutdown_fn + 0x180));
        if (iVar3 == -0xb) {
          pbVar1 = (byte *)((long)&self[1].fn + 4);
          *pbVar1 = *pbVar1 | 2;
          return;
        }
        if (iVar3 == 0) {
          nn_msg_init((nn_msg *)(self[1].shutdown_fn + 0x180),0);
          if (iVar2 != 0) {
            nn_pipebase_received((nn_pipebase *)&self[1].state);
          }
          dst = (nn_fsm *)self[1].shutdown_fn;
          event = (nn_fsm_event *)&dst[6].owner;
          iVar2 = 5;
          goto LAB_0012c4aa;
        }
        nn_backtrace_print();
        __stream = _stderr;
        pcVar5 = nn_err_strerror(-iVar3);
        uVar6 = (ulong)(uint)-iVar3;
        uVar7 = 0x1b3;
        goto LAB_0012c568;
      }
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected action";
      uVar6 = 0x6c41;
      uVar7 = 0x1d3;
    }
    else {
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected source";
      uVar7 = 0x1d7;
    }
    break;
  case 5:
    if (src == 0x6c41) {
      if (type == 5) {
        return;
      }
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected action";
      uVar6 = 0x6c41;
      uVar7 = 0x1e9;
    }
    else {
      nn_backtrace_print();
      uVar4 = (ulong)*(uint *)&self[1].fn;
      pcVar5 = "Unexpected source";
      uVar7 = 0x1ec;
    }
    break;
  default:
    nn_backtrace_print();
    uVar4 = (ulong)*(uint *)&self[1].fn;
    pcVar5 = "Unexpected state";
    uVar7 = 499;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar5,uVar4,uVar6,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
          ,uVar7);
LAB_0012c572:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sinproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    int rc;
    struct nn_sinproc *sinproc;
    int empty;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);

    switch (sinproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                sinproc->state = NN_SINPROC_STATE_CONNECTING;
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  CONNECTING state.                                                         */
/*  CONNECT request was sent to the peer. Now we are waiting for the          */
/*  acknowledgement.                                                          */
/******************************************************************************/
    case NN_SINPROC_STATE_CONNECTING:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SINPROC_ACTION_READY:
                sinproc->state = NN_SINPROC_STATE_READY;
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_READY:
                sinproc->peer = (struct nn_sinproc*) srcptr;
                rc = nn_pipebase_start (&sinproc->pipebase);
                errnum_assert (rc == 0, -rc);
                sinproc->state = NN_SINPROC_STATE_ACTIVE;
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->event_connect,
                    NN_SINPROC_SRC_PEER, NN_SINPROC_ACCEPTED, self);
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  READY state.                                                              */
/*                                                                            */
/******************************************************************************/
    case NN_SINPROC_STATE_READY:
        switch (src) {

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_READY:
                /*  This means both peers sent READY so they are both
                    ready for receiving messages  */
                rc = nn_pipebase_start (&sinproc->pipebase);
                errnum_assert (rc == 0, -rc);
                sinproc->state = NN_SINPROC_STATE_ACTIVE;
                return;
            case NN_SINPROC_ACCEPTED:
                rc = nn_pipebase_start (&sinproc->pipebase);
		/*  We can fail this due to excl_add saying we are already
                    connected. */
                if (rc != 0) {
                    nn_pipebase_stop (&sinproc->pipebase);
                    sinproc->state = NN_SINPROC_STATE_DISCONNECTED;
                    sinproc->peer = NULL;
                    nn_fsm_raise (&sinproc->fsm, &sinproc->event_disconnect,
                        NN_SINPROC_DISCONNECT);
                    return;
                }
                errnum_assert (rc == 0, -rc);
                sinproc->state = NN_SINPROC_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SINPROC_STATE_ACTIVE:
        switch (src) {

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_SENT:

                empty = nn_msgqueue_empty (&sinproc->msgqueue);

                /*  Push the message to the inbound message queue. */
                rc = nn_msgqueue_send (&sinproc->msgqueue,
                    &sinproc->peer->msg);
                if (rc == -EAGAIN) {
                    sinproc->flags |= NN_SINPROC_FLAG_RECEIVING;
                    return;
                }
                errnum_assert (rc == 0, -rc);
                nn_msg_init (&sinproc->peer->msg, 0);

                /*  Notify the user that there's a message to receive. */
                if (empty)
                    nn_pipebase_received (&sinproc->pipebase);

                /*  Notify the peer that the message was received. */
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->peer->event_received, NN_SINPROC_SRC_PEER,
                    NN_SINPROC_RECEIVED, sinproc);

                return;

            case NN_SINPROC_RECEIVED:
                nn_assert (sinproc->flags & NN_SINPROC_FLAG_SENDING);
                nn_pipebase_sent (&sinproc->pipebase);
                sinproc->flags &= ~NN_SINPROC_FLAG_SENDING;
                return;

            case NN_SINPROC_DISCONNECT:
                nn_pipebase_stop (&sinproc->pipebase);
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->peer->event_disconnect, NN_SINPROC_SRC_PEER,
                    NN_SINPROC_DISCONNECT, sinproc);
                sinproc->state = NN_SINPROC_STATE_DISCONNECTED;
                sinproc->peer = NULL;
                nn_fsm_raise (&sinproc->fsm, &sinproc->event_disconnect,
                    NN_SINPROC_DISCONNECT);
                return;

            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  DISCONNECTED state.                                                       */
/*  The peer have already closed the connection, but the object was not yet   */
/*  asked to stop.                                                            */
/******************************************************************************/
    case NN_SINPROC_STATE_DISCONNECTED:
        switch (src) {
        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_RECEIVED:
                /*  This case can safely be ignored. It may happen when
                    nn_close() comes before the already enqueued
                    NN_SINPROC_RECEIVED has been delivered.  */
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            };
        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sinproc->state, src, type);
    }
}